

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring64_bitmap_add_many(roaring64_bitmap_t *r,size_t n_args,uint64_t *vals)

{
  long lVar1;
  roaring64_bulk_context_t context;
  roaring64_bulk_context_t local_38;
  
  if (n_args != 0) {
    local_38.high_bytes[0] = '\0';
    local_38.high_bytes[1] = '\0';
    local_38.high_bytes[2] = '\0';
    local_38.high_bytes[3] = '\0';
    local_38.high_bytes[4] = '\0';
    local_38.high_bytes[5] = '\0';
    local_38._6_2_ = 0;
    local_38.leaf = (roaring64_leaf_t *)0x0;
    lVar1 = 0;
    do {
      roaring64_bitmap_add_bulk(r,&local_38,*(uint64_t *)((long)vals + lVar1));
      lVar1 = lVar1 + 8;
    } while (n_args << 3 != lVar1);
  }
  return;
}

Assistant:

void roaring64_bitmap_add_many(roaring64_bitmap_t *r, size_t n_args,
                               const uint64_t *vals) {
    if (n_args == 0) {
        return;
    }
    const uint64_t *end = vals + n_args;
    roaring64_bulk_context_t context = CROARING_ZERO_INITIALIZER;
    for (const uint64_t *current_val = vals; current_val != end;
         current_val++) {
        roaring64_bitmap_add_bulk(r, &context, *current_val);
    }
}